

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_lambda.cpp
# Opt level: O1

void __thiscall lambda_apply_Test::TestBody(lambda_apply_Test *this)

{
  bool bVar1;
  char *message;
  AssertionResult gtest_ar;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_28;
  AssertHelper local_20;
  internal local_18 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_10;
  
  local_28.ptr_._0_4_ = 0x28;
  local_20.data_._0_4_ = 0x28;
  testing::internal::CmpHelperEQ<int,int>
            (local_18,"lmd::apply(mul, args)","40",(int *)&local_28,(int *)&local_20);
  if (local_18[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_28);
    if (local_10.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((local_10.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_20,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/jtomschroeder[P]lambda/test/test_lambda.cpp"
               ,0xb,message);
    testing::internal::AssertHelper::operator=(&local_20,(Message *)&local_28);
    testing::internal::AssertHelper::~AssertHelper(&local_20);
    if (local_28.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_28.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_28.ptr_ + 8))();
      }
      local_28.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
      ;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_10,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  return;
}

Assistant:

TEST(lambda, apply) {
    auto args = std::make_tuple(2, 4, 5);
    ASSERT_EQ(lmd::apply(mul, args), 40);
}